

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O1

value_type * __thiscall nonstd::optional_bare::optional<char>::value(optional<char> *this)

{
  logic_error *this_00;
  undefined **local_20 [2];
  
  if (this->has_value_ != false) {
    return &this->value_;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error((logic_error *)local_20,"bad optional access");
  local_20[0] = &PTR__logic_error_0019eca8;
  std::logic_error::logic_error(this_00,(logic_error *)local_20);
  *(undefined ***)this_00 = &PTR__logic_error_0019eca8;
  __cxa_throw(this_00,&bad_optional_access::typeinfo,std::logic_error::~logic_error);
}

Assistant:

value_type const & value() const
    {
#if optional_CONFIG_NO_EXCEPTIONS
        assert( has_value() );
#else
        if ( ! has_value() )
            throw bad_optional_access();
#endif
        return value_;
    }